

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O2

vec4 ImageCodec::decodeFLOAT_FP32Vec<4>(ImageCodec *param_1,void *ptr)

{
  float fVar1;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 aVar2;
  float *pfVar3;
  int i;
  long lVar4;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 local_28;
  
  local_28._0_8_ = 0;
  local_28._8_8_ = 0x3f80000000000000;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    fVar1 = *(float *)((long)ptr + lVar4 * 4);
    pfVar3 = glm::vec<4,_float,_(glm::precision)0>::operator[]
                       ((vec<4,_float,_(glm::precision)0> *)&local_28.field_0,(length_type)lVar4);
    *pfVar3 = fVar1;
  }
  aVar2._8_8_ = local_28._8_8_;
  aVar2._0_8_ = local_28._0_8_;
  return (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)
         (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)aVar2.field_0;
}

Assistant:

static glm::vec4 decodeFLOAT_FP32Vec(const ImageCodec*, const void* ptr) {
        static_assert((COMPONENTS > 0) && (COMPONENTS <= 4));
        auto data = reinterpret_cast<const float*>(ptr);
        glm::vec4 result(0.f, 0.f, 0.f, 1.f);
        for (int i = 0; i < COMPONENTS; ++i)
            result[i] = data[i];
        return result;
    }